

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

int FIX::DateTime::convertToNanos(int fraction,int precision)

{
  int local_14;
  int nanos;
  int precision_local;
  int fraction_local;
  
  local_14 = fraction;
  switch(precision) {
  case 0:
    local_14 = fraction * 1000000000;
    break;
  case 1:
    local_14 = fraction * 100000000;
    break;
  case 2:
    local_14 = fraction * 10000000;
    break;
  case 3:
    local_14 = fraction * 1000000;
    break;
  case 4:
    local_14 = fraction * 100000;
    break;
  case 5:
    local_14 = fraction * 10000;
    break;
  case 6:
    local_14 = fraction * 1000;
    break;
  case 7:
    local_14 = fraction * 100;
    break;
  case 8:
    local_14 = fraction * 10;
    break;
  case 9:
  }
  return local_14;
}

Assistant:

static int convertToNanos(int fraction, int precision) {
    int nanos;

    switch (precision) {
    case 0:
      nanos = fraction * PRECISION_FACTOR[0];
      break;

    case 1:
      nanos = fraction * PRECISION_FACTOR[1];
      break;

    case 2:
      nanos = fraction * PRECISION_FACTOR[2];
      break;

    case 3:
      nanos = fraction * PRECISION_FACTOR[3];
      break;

    case 4:
      nanos = fraction * PRECISION_FACTOR[4];
      break;

    case 5:
      nanos = fraction * PRECISION_FACTOR[5];
      break;

    case 6:
      nanos = fraction * PRECISION_FACTOR[6];
      break;

    case 7:
      nanos = fraction * PRECISION_FACTOR[7];
      break;

    case 8:
      nanos = fraction * PRECISION_FACTOR[8];
      break;

    case 9:
    default:
      nanos = fraction * PRECISION_FACTOR[9];
      break;
    }

    return nanos;
  }